

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::BeginPopupModal(char *name,bool *p_open,ImGuiWindowFlags flags)

{
  ImGuiNextWindowData *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  ImGuiID id;
  
  pIVar5 = GImGui;
  id = ImGuiWindow::GetID(GImGui->CurrentWindow,name,(char *)0x0);
  bVar6 = IsPopupOpen(id);
  pIVar4 = GImGui;
  pIVar1 = &pIVar5->NextWindowData;
  if (bVar6) {
    if (pIVar1->PosCond == 0) {
      IVar2 = (pIVar5->IO).DisplaySize;
      IVar3.y = IVar2.y * 0.5;
      IVar3.x = IVar2.x * 0.5;
      (GImGui->NextWindowData).PosVal = IVar3;
      (pIVar4->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar4->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar4->NextWindowData).PosCond = 8;
    }
    bVar6 = Begin(name,p_open,flags | 0xc000120);
    if (bVar6) {
      if (p_open == (bool *)0x0) {
        return true;
      }
      if (*p_open != false) {
        return true;
      }
      EndPopup();
      ClosePopup(id);
    }
    else {
      EndPopup();
    }
  }
  else {
    (pIVar5->NextWindowData).CollapsedCond = 0;
    (pIVar5->NextWindowData).SizeConstraintCond = 0;
    (pIVar5->NextWindowData).FocusCond = 0;
    (pIVar5->NextWindowData).BgAlphaCond = 0;
    pIVar1->PosCond = 0;
    pIVar1->SizeCond = 0;
    (pIVar5->NextWindowData).ContentSizeCond = 0;
    (pIVar5->NextWindowData).CollapsedCond = 0;
  }
  return false;
}

Assistant:

bool ImGui::BeginPopupModal(const char* name, bool* p_open, ImGuiWindowFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    const ImGuiID id = window->GetID(name);
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    // Center modal windows by default
    // FIXME: Should test for (PosCond & window->SetWindowPosAllowFlags) with the upcoming window.
    if (g.NextWindowData.PosCond == 0)
        SetNextWindowPos(g.IO.DisplaySize * 0.5f, ImGuiCond_Appearing, ImVec2(0.5f, 0.5f));

    bool is_open = Begin(name, p_open, flags | ImGuiWindowFlags_Popup | ImGuiWindowFlags_Modal | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoSavedSettings);
    if (!is_open || (p_open && !*p_open)) // NB: is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    {
        EndPopup();
        if (is_open)
            ClosePopup(id);
        return false;
    }

    return is_open;
}